

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void triangle(vec2i *pts,TGAImage *image,TGAColor color)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  vec2i P;
  ulong y;
  uint uVar9;
  uint uVar10;
  ulong x;
  uint uVar11;
  vec3f bc_screen;
  TGAColor local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  TGAImage *local_50;
  vec3f local_48;
  
  local_80.bgra = color.bgra;
  local_80.bytespp = color.bytespp;
  sVar5 = TGAImage::get_width(image);
  uVar10 = (int)sVar5 - 1;
  sVar5 = TGAImage::get_height(image);
  sVar6 = TGAImage::get_width(image);
  local_50 = image;
  sVar7 = TGAImage::get_height(image);
  uVar11 = (int)sVar6 - 1;
  uVar4 = (int)sVar7 - 1;
  uVar9 = 0;
  local_60 = 0;
  lVar8 = 0;
  local_58 = (ulong)((int)sVar5 - 1);
  do {
    uVar1 = pts[lVar8].y;
    if ((int)uVar1 < (int)local_58) {
      local_58 = (ulong)uVar1;
    }
    if ((int)local_58 < 1) {
      local_58 = 0;
    }
    uVar2 = pts[lVar8].x;
    if ((int)uVar9 <= (int)uVar2) {
      uVar9 = uVar2;
    }
    if ((int)uVar11 <= (int)uVar9) {
      uVar9 = uVar11;
    }
    if ((int)uVar2 < (int)uVar10) {
      uVar10 = uVar2;
    }
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    if ((int)local_60 <= (int)uVar1) {
      local_60 = (ulong)uVar1;
    }
    if ((int)uVar4 <= (int)local_60) {
      local_60 = (ulong)uVar4;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  if ((int)uVar10 <= (int)uVar9) {
    iVar3 = (int)local_60;
    x = (ulong)uVar10;
    local_68 = (ulong)(uVar9 + 1);
    local_78 = local_58 << 0x20;
    local_70 = local_58;
    do {
      if ((int)local_58 <= (int)local_60) {
        P = (vec2i)((x & 0xffffffff) + local_78);
        y = local_70;
        do {
          barycentric(&local_48,pts,P);
          if (((0.0 <= local_48.x) && (0.0 <= local_48.y)) && (0.0 <= local_48.z)) {
            TGAImage::set(local_50,x,y,&local_80);
          }
          y = y + 1;
          P = (vec2i)((long)P + 0x100000000);
        } while (iVar3 + 1 != (int)y);
      }
      x = x + 1;
    } while ((int)local_68 != (int)x);
  }
  return;
}

Assistant:

void triangle(vec2i *pts, TGAImage &image, TGAColor color)
{
    vec2i bboxmin(image.get_width() - 1, image.get_height() - 1);
    vec2i bboxmax(0, 0);
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (size_t i = 0; i < 3; i++) {
        for (size_t j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec2i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts, P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            image.set(static_cast<int>(P.x), static_cast<int>(P.y), color);
        }
    }
}